

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O3

VkDeviceSize
vkt::memory::anon_unknown_0::randomSize(Random *rng,VkDeviceSize atomSize,VkDeviceSize maxSize)

{
  deUint32 dVar1;
  deUint32 dVar2;
  
  if (1 < maxSize / atomSize) {
    dVar1 = deRandom_getUint32(&rng->m_rnd);
    dVar2 = deRandom_getUint32(&rng->m_rnd);
    atomSize = atomSize * (CONCAT44(dVar1,dVar2) % (maxSize / atomSize) + 1);
  }
  return atomSize;
}

Assistant:

VkDeviceSize randomSize (de::Random& rng, VkDeviceSize atomSize, VkDeviceSize maxSize)
{
	const VkDeviceSize maxSizeInAtoms = maxSize / atomSize;

	DE_ASSERT(maxSizeInAtoms > 0);

	return maxSizeInAtoms > 1
			? atomSize * (1 + (VkDeviceSize)(rng.getUint64() % (deUint64)maxSizeInAtoms))
			: atomSize;
}